

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall
slang::parsing::Lexer::splitTokens
          (Lexer *this,BumpAllocator *alloc,Diagnostics *diagnostics,SourceManager *sourceManager,
          Token sourceToken,size_t offset,KeywordVersion keywordVersion,
          SmallVectorBase<slang::parsing::Token> *results)

{
  bool bVar1;
  SourceLocation location;
  SourceLocation SVar2;
  BufferID buffer;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined7 in_stack_00000011;
  Token token;
  Token sourceToken_local;
  Lexer lexer;
  
  sourceToken_local.info = sourceToken._0_8_;
  sourceToken_local._0_8_ = sourceManager;
  location = Token::location(&sourceToken_local);
  bVar1 = SourceManager::isMacroLoc((SourceManager *)diagnostics,location);
  if (bVar1) {
    location = SourceManager::getOriginalLoc((SourceManager *)diagnostics,location);
  }
  buffer.id = location._0_4_ & 0xfffffff;
  sVar3 = SourceManager::getSourceText((SourceManager *)diagnostics,buffer);
  if (sVar3._M_len == 0) {
    assert::assertFailed
              ("!sourceText.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Lexer.cpp"
               ,0xb4,
               "static void slang::parsing::Lexer::splitTokens(BumpAllocator &, Diagnostics &, const SourceManager &, Token, size_t, KeywordVersion, SmallVectorBase<Token> &)"
              );
  }
  token = (Token)Token::rawText(&sourceToken_local);
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&token,
                     (size_type)sourceToken.info,0xffffffffffffffff);
  Lexer(&lexer,buffer,sVar3,bVar4._M_str,(BumpAllocator *)this,(Diagnostics *)alloc,
        (LexerOptions)0x10);
  sVar3 = Token::rawText(&sourceToken_local);
  while( true ) {
    token = lex(&lexer,(KeywordVersion)offset);
    if (token.kind == EndOfFile) break;
    SVar2 = Token::location(&token);
    if ((SVar2._0_4_ & 0xfffffff) != buffer.id) break;
    SVar2 = Token::location(&token);
    if (sVar3._M_len + ((ulong)location >> 0x1c) <= (ulong)SVar2 >> 0x1c) break;
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
              ((SmallVectorBase<slang::parsing::Token> *)CONCAT71(in_stack_00000011,keywordVersion),
               &token);
  }
  ~Lexer(&lexer);
  return;
}

Assistant:

void Lexer::splitTokens(BumpAllocator& alloc, Diagnostics& diagnostics,
                        const SourceManager& sourceManager, Token sourceToken, size_t offset,
                        KeywordVersion keywordVersion, SmallVectorBase<Token>& results) {
    auto loc = sourceToken.location();
    if (sourceManager.isMacroLoc(loc))
        loc = sourceManager.getOriginalLoc(loc);

    auto sourceText = sourceManager.getSourceText(loc.buffer());
    ASSERT(!sourceText.empty());

    Lexer lexer{loc.buffer(), sourceText,  sourceToken.rawText().substr(offset).data(),
                alloc,        diagnostics, LexerOptions{}};

    size_t endOffset = loc.offset() + sourceToken.rawText().length();
    while (true) {
        Token token = lexer.lex(keywordVersion);
        if (token.kind == TokenKind::EndOfFile || token.location().buffer() != loc.buffer() ||
            token.location().offset() >= endOffset)
            break;

        results.push_back(token);
    }
}